

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

QDBusMenuItemList * __thiscall
QDBusMenuAdaptor::GetGroupProperties
          (QDBusMenuAdaptor *this,QList<int> *ids,QStringList *propertyNames)

{
  bool bVar1;
  QDebug *o;
  char *in_RCX;
  QMessageLogger *in_RDX;
  QStringList *in_RSI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *this_00;
  QLoggingCategory *ids_00;
  char *in_stack_ffffffffffffffa8;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  ids_00 = in_RDI;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,in_RDI);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae90d2);
    QMessageLogger::QMessageLogger
              (in_RDX,in_RCX,(int)((ulong)this_00 >> 0x20),(char *)in_RDI,(char *)0xae90e8);
    QMessageLogger::debug();
    ::operator<<((QDebug *)in_RSI,(QList<int> *)in_RDX);
    ::operator<<((QDebug *)in_RSI,(QList<QString> *)in_RDX);
    o = QDebug::operator<<((QDebug *)in_RSI,in_stack_ffffffffffffffa8);
    QDebug::QDebug(&local_28,o);
    QDBusMenuItem::items((QList<int> *)ids_00,in_RSI);
    ::operator<<((QDebug *)in_RSI,(QList<QDBusMenuItem> *)in_RDX);
    QDebug::~QDebug(&local_20);
    QList<QDBusMenuItem>::~QList((QList<QDBusMenuItem> *)0xae9185);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  QDBusMenuItem::items((QList<int> *)ids_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusMenuItemList *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMenuItemList QDBusMenuAdaptor::GetGroupProperties(const QList<int> &ids, const QStringList &propertyNames)
{
    qCDebug(qLcMenu) << ids << propertyNames << "=>" << QDBusMenuItem::items(ids, propertyNames);
    return QDBusMenuItem::items(ids, propertyNames);
}